

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_schema.c
# Opt level: O0

int cfg_schema_validate(cfg_db *db,_Bool cleanup,_Bool ignore_unknown,autobuf *out)

{
  cfg_schema_entry *pcVar1;
  _Bool _Var2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  long local_400;
  long local_3f8;
  long local_3f0;
  long local_3e0;
  char *local_3d8;
  list_entity *local_3b8;
  cfg_schema_section *local_3b0;
  list_entity *__tempptr_19;
  list_entity *__tempptr_18;
  list_entity *__tempptr_17;
  list_entity *__tempptr_16;
  list_entity *__tempptr_15;
  list_entity *__tempptr_14;
  list_entity *__tempptr_13;
  list_entity *__tempptr_12;
  list_entity *__tempptr_11;
  list_entity *__tempptr_10;
  list_entity *__tempptr_9;
  list_entity *__tempptr_8;
  list_entity *__tempptr_7;
  list_entity *__tempptr_6;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  _Bool hasName;
  _Bool warning;
  ulong uStack_260;
  _Bool error;
  size_t i;
  cfg_schema_entry *schema_entry;
  cfg_schema_section *schema_section_last;
  cfg_schema_section *schema_section_first;
  cfg_schema_section *schema_section;
  cfg_entry *entry_it;
  cfg_entry *entry;
  cfg_named_section *named_it;
  cfg_named_section *named;
  cfg_section_type *section_it;
  cfg_section_type *section;
  char section_name [256];
  autobuf *out_local;
  _Bool ignore_unknown_local;
  _Bool cleanup_local;
  cfg_db *db_local;
  
  __tempptr._7_1_ = false;
  if (db->schema == (cfg_schema *)0x0) {
    db_local._4_4_ = -1;
  }
  else {
    section_it = (cfg_section_type *)(db->sectiontypes).list_head.next;
    named = (cfg_named_section *)(section_it->node).list.next;
    while ((section_it->node).list.prev != (db->sectiontypes).list_head.prev) {
      local_3b0 = (cfg_schema_section *)avl_find(db->schema,section_it->type);
      if (local_3b0 == (cfg_schema_section *)0x0) {
        local_3b0 = (cfg_schema_section *)0x0;
      }
      if (local_3b0 == (cfg_schema_section *)0x0) {
        if (!ignore_unknown) {
          cfg_append_printable_line
                    (out,"Cannot find schema for section type \'%s\'",section_it->type);
          if (cleanup) {
            cfg_db_remove_sectiontype(db,section_it->type);
          }
          __tempptr._7_1_ = true;
        }
      }
      else {
        local_3b8 = (list_entity *)avl_find_lessequal(db->schema,section_it->type);
        if (local_3b8 == (list_entity *)0x0) {
          local_3b8 = (list_entity *)0x0;
        }
        schema_section_first = local_3b0;
        while ((schema_section_first->_section_node).list.prev != local_3b8) {
          named_it = (cfg_named_section *)(section_it->names).list_head.next;
          entry = (cfg_entry *)(named_it->node).list.next;
          while ((named_it->node).list.prev != (section_it->names).list_head.prev) {
            bVar6 = false;
            bVar5 = named_it->name != (char *)0x0;
            if ((bVar5) && (bVar6 = schema_section_first->mode == CFG_SSMODE_UNNAMED, bVar6)) {
              cfg_append_printable_line
                        (out,
                         "The section type \'%s\' has to be used without a name (\'%s\' was given as a name)"
                         ,section_it->type,named_it->name);
            }
            if ((bVar5) && (pcVar4 = strchr(named_it->name,0x20), pcVar4 != (char *)0x0)) {
              cfg_append_printable_line
                        (out,"The section name \'%s\' for type \'%s\' contains illegal characters",
                         named_it->name,section_it->type);
              bVar6 = true;
            }
            if ((bVar6) && (cleanup)) {
              cfg_db_remove_namedsection(db,section_it->type,named_it->name);
            }
            __tempptr._7_1_ = __tempptr._7_1_ || bVar6;
            if (!bVar6) {
              pcVar4 = "";
              if (bVar5) {
                pcVar4 = "=";
                local_3d8 = named_it->name;
              }
              else {
                local_3d8 = "";
              }
              snprintf((char *)&section,0x100,"\'%s%s%s\'",section_it->type,pcVar4,local_3d8);
              entry_it = (cfg_entry *)(named_it->entries).list_head.next;
              schema_section = (cfg_schema_section *)(entry_it->node).list.next;
              while ((entry_it->node).list.prev != (named_it->entries).list_head.prev) {
                _Var2 = _validate_cfg_entry(db,section_it,named_it,entry_it,(char *)&section,cleanup
                                            ,ignore_unknown,out);
                __tempptr._7_1_ = __tempptr._7_1_ || _Var2;
                entry_it = (cfg_entry *)schema_section;
                schema_section = (cfg_schema_section *)(schema_section->_section_node).list.next;
              }
              if (((!__tempptr._7_1_) &&
                  (schema_section_first->cb_validate !=
                   (_func_int_char_ptr_cfg_named_section_ptr_autobuf_ptr *)0x0)) &&
                 (iVar3 = (*schema_section_first->cb_validate)((char *)&section,named_it,out),
                 iVar3 != 0)) {
                __tempptr._7_1_ = true;
              }
            }
            named_it = (cfg_named_section *)entry;
            entry = (cfg_entry *)(entry->node).list.next;
          }
          schema_section_first =
               (cfg_schema_section *)(schema_section_first->_section_node).list.next;
        }
        if ((cleanup) && ((section_it->names).count == 0)) {
          cfg_db_remove_sectiontype(db,section_it->type);
        }
      }
      section_it = (cfg_section_type *)named;
      named = (cfg_named_section *)(named->node).list.next;
    }
    schema_section_first = (cfg_schema_section *)(db->schema->sections).list_head.next;
    while ((schema_section_first->_section_node).list.prev != (db->schema->sections).list_head.prev)
    {
      local_3e0 = avl_find(db,schema_section_first->type);
      if (local_3e0 == 0) {
        local_3e0 = 0;
      }
      if (schema_section_first->mode == CFG_SSMODE_NAMED_MANDATORY) {
        if ((local_3e0 == 0) || (*(int *)(local_3e0 + 0x60) == 0)) {
          bVar6 = true;
        }
        else {
          bVar6 = false;
          if (*(long *)(*(long *)(local_3e0 + 0x48) + 0x38) == 0) {
            bVar6 = *(uint *)(local_3e0 + 0x60) < 2;
          }
        }
        if (bVar6) {
          cfg_append_printable_line
                    (out,"Missing mandatory section of type \'%s\'",schema_section_first->type);
        }
        __tempptr._7_1_ = __tempptr._7_1_ || bVar6;
      }
      for (uStack_260 = 0; uStack_260 < schema_section_first->entry_count;
          uStack_260 = uStack_260 + 1) {
        pcVar1 = schema_section_first->entries;
        if ((local_3e0 != 0) && (pcVar1[uStack_260].def.value == (char *)0x0)) {
          bVar6 = true;
          local_3f0 = avl_find(local_3e0 + 0x48,0);
          if (local_3f0 == 0) {
            local_3f0 = 0;
          }
          if (local_3f0 != 0) {
            local_3f8 = avl_find(local_3f0 + 0x48,pcVar1[uStack_260].key.entry);
            if (local_3f8 == 0) {
              local_3f8 = 0;
            }
            bVar6 = local_3f8 == 0;
          }
          if (bVar6) {
            bVar6 = false;
            named_it = *(cfg_named_section **)(local_3e0 + 0x48);
            while ((named_it->node).list.prev != *(list_entity **)(local_3e0 + 0x50)) {
              if (named_it->name != (char *)0x0) {
                local_400 = avl_find(&named_it->entries,pcVar1[uStack_260].key.entry);
                if (local_400 == 0) {
                  local_400 = 0;
                }
                if (local_400 == 0) {
                  bVar6 = true;
                  cfg_append_printable_line
                            (out,
                             "Missing mandatory entry of type \'%s\', name \'%s\' and key \'%s\'",
                             schema_section_first->type,named_it->name,pcVar1[uStack_260].key.entry)
                  ;
                  break;
                }
              }
              named_it = (cfg_named_section *)(named_it->node).list.next;
            }
          }
          __tempptr._7_1_ = __tempptr._7_1_ || bVar6;
        }
      }
      schema_section_first = (cfg_schema_section *)(schema_section_first->_section_node).list.next;
    }
    db_local._4_4_ = 0;
    if (__tempptr._7_1_) {
      db_local._4_4_ = -1;
    }
  }
  return db_local._4_4_;
}

Assistant:

int
cfg_schema_validate(struct cfg_db *db, bool cleanup, bool ignore_unknown, struct autobuf *out) {
  char section_name[256];
  struct cfg_section_type *section, *section_it;
  struct cfg_named_section *named, *named_it;
  struct cfg_entry *entry, *entry_it;

  struct cfg_schema_section *schema_section;
  struct cfg_schema_section *schema_section_first, *schema_section_last;
  struct cfg_schema_entry *schema_entry;
  size_t i;

  bool error = false;
  bool warning = false;
  bool hasName = false;

  if (db->schema == NULL) {
    return -1;
  }

  CFG_FOR_ALL_SECTION_TYPES(db, section, section_it) {
    /* check for missing schema sections */
    schema_section_first = avl_find_element(&db->schema->sections, section->type, schema_section_first, _section_node);

    if (schema_section_first == NULL) {
      if (ignore_unknown) {
        continue;
      }

      cfg_append_printable_line(out, "Cannot find schema for section type '%s'", section->type);

      if (cleanup) {
        cfg_db_remove_sectiontype(db, section->type);
      }

      error |= true;
      continue;
    }

    schema_section_last = avl_find_le_element(&db->schema->sections, section->type, schema_section_last, _section_node);

    /* iterate over all schema for a certain section type */
    avl_for_element_range(schema_section_first, schema_section_last, schema_section, _section_node) {
      /* check data of named sections in db */
      CFG_FOR_ALL_SECTION_NAMES(section, named, named_it) {
        warning = false;
        hasName = cfg_db_is_named_section(named);

        if (hasName) {
          if (schema_section->mode == CFG_SSMODE_UNNAMED) {
            cfg_append_printable_line(out,
              "The section type '%s'"
              " has to be used without a name"
              " ('%s' was given as a name)",
              section->type, named->name);

            warning = true;
          }
        }

        if (hasName && !cfg_is_allowed_section_name(named->name)) {
          cfg_append_printable_line(out,
            "The section name '%s' for"
            " type '%s' contains illegal characters",
            named->name, section->type);
          warning = true;
        }

        /* test abort condition */
        if (warning && cleanup) {
          /* remove bad named section */
          cfg_db_remove_namedsection(db, section->type, named->name);
        }

        error |= warning;

        if (warning) {
          continue;
        }

        /* initialize section_name field for validate */
        snprintf(section_name, sizeof(section_name), "'%s%s%s'", section->type, hasName ? "=" : "",
          hasName ? named->name : "");

        /* check for bad values */
        CFG_FOR_ALL_ENTRIES(named, entry, entry_it) {
          warning = _validate_cfg_entry(db, section, named, entry, section_name, cleanup, ignore_unknown, out);
          error |= warning;
        }

        /* check custom section validation if everything was fine */
        if (!error && schema_section->cb_validate != NULL) {
          if (schema_section->cb_validate(section_name, named, out)) {
            error = true;
          }
        }
      }
    }
    if (cleanup && avl_is_empty(&section->names)) {
      /* if section type is empty, remove it too */
      cfg_db_remove_sectiontype(db, section->type);
    }
  }

  avl_for_each_element(&db->schema->sections, schema_section, _section_node) {
    section = cfg_db_find_sectiontype(db, schema_section->type);
    if (schema_section->mode == CFG_SSMODE_NAMED_MANDATORY) {
      /* search for missing mandatory sections */
      if (section == NULL || avl_is_empty(&section->names)) {
        warning = true;
      }
      else {
        named = avl_first_element(&section->names, named, node);
        warning = !cfg_db_is_named_section(named) && section->names.count < 2;
      }
      if (warning) {
        cfg_append_printable_line(out, "Missing mandatory section of type '%s'", schema_section->type);
      }
      error |= warning;
    }

    /* check for missing values */
    for (i = 0; i < schema_section->entry_count; i++) {
      schema_entry = &schema_section->entries[i];
      if (section && strarray_is_empty_c(&schema_entry->def)) {
        /* found a mandatory schema entry */

        warning = true;
        named = cfg_db_get_unnamed_section(section);
        if (named) {
          /* entry not in unnamed section */
          warning = cfg_db_get_entry(named, schema_entry->key.entry) == NULL;
        }
        if (warning) {
          /* no mandatory value in unnamed section, check named sections */
          warning = false;

          avl_for_each_element(&section->names, named, node) {
            if (named->name != NULL && cfg_db_get_entry(named, schema_entry->key.entry) == NULL) {
              /* found a named section without mandatory entry */
              warning = true;
              cfg_append_printable_line(
                out, "Missing mandatory entry of type '%s', name '%s' and key '%s'",
                schema_section->type, named->name, schema_entry->key.entry);
              break;
            }
          }
        }
        error |= warning;
      }
    }
  }
  return error ? -1 : 0;
}